

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

uint32_t labpack_reader_begin_ext(labpack_reader_t *reader,int8_t *type)

{
  _Bool _Var1;
  uint32_t local_1c;
  uint32_t count;
  int8_t *type_local;
  labpack_reader_t *reader_local;
  
  if (reader == (labpack_reader_t *)0x0) {
    __assert_fail("reader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                  ,0x1d2,"uint32_t labpack_reader_begin_ext(labpack_reader_t *, int8_t *)");
  }
  local_1c = 0;
  _Var1 = labpack_reader_is_ok(reader);
  if (_Var1) {
    local_1c = mpack_expect_ext(reader->decoder,type);
    labpack_reader_check_decoder(reader);
  }
  return local_1c;
}

Assistant:

uint32_t
labpack_reader_begin_ext(labpack_reader_t* reader, int8_t* type)
{
    assert(reader);
    uint32_t count = 0;
    if (labpack_reader_is_ok(reader)) {
        count = mpack_expect_ext(reader->decoder, type);
        labpack_reader_check_decoder(reader);
    }
    return count;
}